

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::XmlReporter::StartTesting(XmlReporter *this)

{
  XmlWriter *this_00;
  pointer pcVar1;
  IConfig *pIVar2;
  undefined8 uVar3;
  undefined1 local_90 [32];
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  ostream *local_50;
  string local_48;
  
  local_50 = (this->m_config).m_stream;
  local_70._M_p = (pointer)&local_60;
  local_90._0_8_ = local_90._0_8_ & 0xffffffffffff0000;
  local_90._8_8_ = (pointer)0x0;
  local_90._16_8_ = (pointer)0x0;
  local_90._24_8_ = (pointer)0x0;
  local_68 = 0;
  local_60._M_local_buf[0] = '\0';
  this_00 = &this->m_xml;
  XmlWriter::operator=(this_00,(XmlWriter *)local_90);
  XmlWriter::~XmlWriter((XmlWriter *)local_90);
  pcVar1 = local_90 + 0x10;
  local_90._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"Catch","");
  XmlWriter::startElement(this_00,(string *)local_90);
  if ((pointer)local_90._0_8_ != pcVar1) {
    operator_delete((void *)local_90._0_8_);
  }
  pIVar2 = (this->m_config).m_fullConfig.m_p;
  if (pIVar2 != (IConfig *)0x0) {
    (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[2])(pIVar2);
  }
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[6])(local_90,pIVar2);
  uVar3 = local_90._8_8_;
  if ((pointer)local_90._0_8_ != pcVar1) {
    operator_delete((void *)local_90._0_8_);
  }
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[3])(pIVar2);
  if ((pointer)uVar3 != (pointer)0x0) {
    local_90._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"name","");
    pIVar2 = (this->m_config).m_fullConfig.m_p;
    if (pIVar2 != (IConfig *)0x0) {
      (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[2])(pIVar2);
    }
    (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[6])(&local_48,pIVar2);
    XmlWriter::writeAttribute(this_00,(string *)local_90,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[3])(pIVar2);
    if ((pointer)local_90._0_8_ != pcVar1) {
      operator_delete((void *)local_90._0_8_);
    }
  }
  return;
}

Assistant:

virtual void StartTesting() {
            m_xml = XmlWriter( m_config.stream() );
            m_xml.startElement( "Catch" );
            if( !m_config.fullConfig()->name().empty() )
                m_xml.writeAttribute( "name", m_config.fullConfig()->name() );
        }